

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot_landscapes.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *filename;
  int from;
  int to;
  ostream *poVar1;
  double xRangeBegin;
  double xRangeEnd;
  double yRangeBegin;
  double yRangeEnd;
  undefined1 local_40 [8];
  Persistence_landscape l;
  char **argv_local;
  int argc_local;
  
  l.number_of_functions_for_projections_to_reals = (size_t)argv;
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "This program creates a gnuplot script from a persistence landscape stored in a file (the file needs "
                          );
  std::operator<<(poVar1,
                  "to be created beforehand). Please call the code with the name of a single landscape file.\n"
                 );
  if (argc == 2) {
    Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
              ((Persistence_landscape *)local_40);
    Gudhi::Persistence_representations::Persistence_landscape::load_landscape_from_file
              ((Persistence_landscape *)local_40,
               *(char **)(l.number_of_functions_for_projections_to_reals + 8));
    filename = *(char **)(l.number_of_functions_for_projections_to_reals + 8);
    xRangeBegin = std::numeric_limits<double>::max();
    xRangeEnd = std::numeric_limits<double>::max();
    yRangeBegin = std::numeric_limits<double>::max();
    yRangeEnd = std::numeric_limits<double>::max();
    from = std::numeric_limits<int>::max();
    to = std::numeric_limits<int>::max();
    Gudhi::Persistence_representations::Persistence_landscape::plot
              ((Persistence_landscape *)local_40,filename,xRangeBegin,xRangeEnd,yRangeBegin,
               yRangeEnd,from,to);
    Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
              ((Persistence_landscape *)local_40);
  }
  else {
    std::operator<<((ostream *)&std::clog,"Wrong parameter list, the program will now terminate \n")
    ;
  }
  argv_local._4_4_ = (uint)(argc != 2);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program creates a gnuplot script from a persistence landscape stored in a file (the file needs "
            << "to be created beforehand). Please call the code with the name of a single landscape file.\n";
  if (argc != 2) {
    std::clog << "Wrong parameter list, the program will now terminate \n";
    return 1;
  }

  Persistence_landscape l;
  l.load_landscape_from_file(argv[1]);
  l.plot(argv[1]);

  return 0;
}